

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::interval_t,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::NormalizedIntervalOperator>
               (interval_t *ldata,interval_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  interval_t input;
  idx_t iVar1;
  int64_t unaff_RBX;
  idx_t iVar2;
  int64_t *piVar3;
  interval_t iVar4;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar3 = &result_data->micros;
    for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
      iVar4.micros = unaff_RBX;
      iVar4._0_8_ = result_mask;
      iVar4 = NormalizedIntervalOperator::Operation<duckdb::interval_t,duckdb::interval_t>(iVar4);
      ((interval_t *)(piVar3 + -1))->months = (int)iVar4._0_8_;
      ((interval_t *)(piVar3 + -1))->days = (int)((ulong)iVar4._0_8_ >> 0x20);
      *piVar3 = iVar4.micros;
      piVar3 = piVar3 + 2;
    }
  }
  else {
    piVar3 = &result_data->micros;
    for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
      iVar1 = iVar2;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        iVar1 = (idx_t)sel_vector->sel_vector[iVar2];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[iVar1 >> 6] >>
           (iVar1 & 0x3f) & 1) == 0) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_mask->super_TemplatedValidityMask<unsigned_long>,iVar2);
      }
      else {
        input.micros = unaff_RBX;
        input._0_8_ = result_mask;
        iVar4 = NormalizedIntervalOperator::Operation<duckdb::interval_t,duckdb::interval_t>(input);
        ((interval_t *)(piVar3 + -1))->months = (int)iVar4._0_8_;
        ((interval_t *)(piVar3 + -1))->days = (int)((ulong)iVar4._0_8_ >> 0x20);
        *piVar3 = iVar4.micros;
      }
      piVar3 = piVar3 + 2;
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}